

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_xml.c
# Opt level: O1

lyd_node * lyd_parse_xml(ly_ctx *ctx,lyxml_elem **root,int options,...)

{
  LYS_NODE LVar1;
  lyd_node *plVar2;
  lyxml_elem *plVar3;
  unres_data *puVar4;
  char in_AL;
  int iVar5;
  long *plVar6;
  undefined8 *puVar7;
  lyd_node *plVar8;
  lyd_node *plVar9;
  lyd_node *in_RCX;
  char *pcVar10;
  ulong uVar11;
  lyd_node *plVar12;
  lyd_node *plVar13;
  LY_ERR no;
  lyd_node *plVar14;
  undefined8 in_R8;
  undefined8 in_R9;
  lyxml_elem *plVar15;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_158 [24];
  lyd_node *local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  lyd_node *local_a8;
  lyd_node *local_a0;
  char *local_98;
  lyd_node *local_90;
  unres_data *local_88;
  lyd_node *local_80;
  lyd_node *act_notif;
  va_list ap;
  lyd_node *local_48;
  lyxml_elem *local_40;
  lyd_node *local_38;
  lyd_node *result;
  
  if (in_AL != '\0') {
    local_128 = in_XMM0_Qa;
    local_118 = in_XMM1_Qa;
    local_108 = in_XMM2_Qa;
    local_f8 = in_XMM3_Qa;
    local_e8 = in_XMM4_Qa;
    local_d8 = in_XMM5_Qa;
    local_c8 = in_XMM6_Qa;
    local_b8 = in_XMM7_Qa;
  }
  local_38 = (lyd_node *)0x0;
  local_80 = (lyd_node *)0x0;
  local_140 = in_RCX;
  local_138 = in_R8;
  local_130 = in_R9;
  if (ctx == (ly_ctx *)0x0 || root == (lyxml_elem **)0x0) {
    pcVar10 = "Invalid arguments (%s()).";
    ctx = (ly_ctx *)0x0;
  }
  else {
    iVar5 = lyp_data_check_options(ctx,options,"lyd_parse_xml");
    if (iVar5 != 0) {
      return (lyd_node *)0x0;
    }
    if (((options & 0x20U) != 0) || (*root != (lyxml_elem *)0x0)) {
      local_88 = (unres_data *)calloc(1,0x28);
      plVar14 = local_140;
      if (local_88 == (unres_data *)0x0) {
        pcVar10 = "Memory allocation failed (%s()).";
        no = LY_EMEM;
        local_88 = (unres_data *)0x0;
        goto LAB_0013f556;
      }
      ap[0].overflow_arg_area = local_158;
      ap[0]._0_8_ = &stack0x00000008;
      act_notif = (lyd_node *)0x3000000018;
      if ((options & 0x20U) != 0) {
        act_notif = (lyd_node *)0x3000000020;
        if ((local_140 != (lyd_node *)0x0) && (local_140->parent == (lyd_node *)0x0)) {
          LVar1 = local_140->schema->nodetype;
          if ((LVar1 & (LYS_RPC|LYS_LIST|LYS_CONTAINER)) != LYS_UNKNOWN) {
            if (LVar1 != LYS_RPC) {
              plVar9 = lyd_dup(local_140,1);
              local_48 = plVar9;
joined_r0x0013fa09:
              plVar8 = local_48;
              local_48 = plVar8;
              if (plVar8 != (lyd_node *)0x0) {
                LVar1 = plVar8->schema->nodetype;
                if (LVar1 == LYS_ACTION) {
LAB_0013fbd5:
                  lyd_free_withsiblings(plVar8->child);
                  goto LAB_0013f5e6;
                }
                if ((LVar1 & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
                  local_48 = plVar8->child;
                }
                else {
                  local_48 = (lyd_node *)0x0;
                }
                if (local_48 == (lyd_node *)0x0) {
                  if (plVar8 == plVar9) goto LAB_0013fbd5;
                  local_48 = plVar8->next;
                }
                if ((local_48 == (lyd_node *)0x0) &&
                   (plVar8 = plVar8->parent, plVar8->parent != plVar9->parent)) {
                  do {
                    local_48 = plVar8->next;
                    if (local_48 != (lyd_node *)0x0) break;
                    plVar8 = plVar8->parent;
                  } while (plVar8->parent != plVar9->parent);
                }
                goto joined_r0x0013fa09;
              }
              ly_log(ctx,LY_LLERR,LY_EINVAL,
                     "%s: invalid variable parameter (const struct lyd_node *rpc_act).",
                     "lyd_parse_xml");
              lyd_free_withsiblings(plVar9);
              plVar15 = (lyxml_elem *)0x0;
              goto LAB_0013fb14;
            }
            plVar8 = _lyd_new((lyd_node *)0x0,local_140->schema,0);
            plVar9 = plVar8;
            goto LAB_0013f5e6;
          }
        }
        pcVar10 = "%s: invalid variable parameter (const struct lyd_node *rpc_act).";
        goto LAB_0013f9d2;
      }
      plVar14 = (lyd_node *)0x0;
      plVar8 = (lyd_node *)0x0;
      plVar9 = (lyd_node *)0x0;
LAB_0013f5e6:
      if ((options & 0x70U) == 0) {
LAB_0013f6e8:
        plVar13 = (lyd_node *)0x0;
      }
      else {
        uVar11 = (ulong)act_notif & 0xffffffff;
        if (uVar11 < 0x29) {
          act_notif = (lyd_node *)CONCAT44(act_notif._4_4_,(int)act_notif + 8);
          plVar6 = (long *)(uVar11 + (long)ap[0].overflow_arg_area);
        }
        else {
          plVar6 = (long *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        plVar2 = (lyd_node *)*plVar6;
        if (plVar2 == (lyd_node *)0x0) goto LAB_0013f6e8;
        plVar12 = plVar2;
        if ((short)options < 0) {
          pcVar10 = 
          "%s: invalid parameter (variable arg const struct lyd_node *data_tree and LYD_OPT_NOEXTDEPS set)."
          ;
LAB_0013f9d2:
          ly_log(ctx,LY_LLERR,LY_EINVAL,pcVar10,"lyd_parse_xml");
          plVar15 = (lyxml_elem *)0x0;
          goto LAB_0013fb14;
        }
        do {
          if (plVar12->parent != (lyd_node *)0x0) {
            pcVar10 = "%s: invalid variable parameter (const struct lyd_node *data_tree).";
            local_48 = plVar12;
            goto LAB_0013f9d2;
          }
          plVar12 = plVar12->next;
        } while (plVar12 != (lyd_node *)0x0);
        do {
          plVar13 = plVar2;
          plVar2 = plVar13->prev;
        } while (plVar13->prev->next != (lyd_node *)0x0);
        local_48 = (lyd_node *)0x0;
        if (((uint)options >> 0xc & 1) != 0) {
          pcVar10 = 
          "%s: invalid parameter (variable arg const struct lyd_node *data_tree with LYD_OPT_NOSIBLINGS)."
          ;
          local_48 = plVar12;
          goto LAB_0013f9d2;
        }
      }
      if (((uint)options >> 0x18 & 1) == 0) {
        local_98 = (char *)0x0;
      }
      else {
        uVar11 = (ulong)act_notif & 0xffffffff;
        if (uVar11 < 0x29) {
          act_notif = (lyd_node *)CONCAT44(act_notif._4_4_,(int)act_notif + 8);
          puVar7 = (undefined8 *)(uVar11 + (long)ap[0].overflow_arg_area);
        }
        else {
          puVar7 = (undefined8 *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        local_98 = (char *)*puVar7;
      }
      plVar15 = *root;
      if (((uint)options >> 0xc & 1) == 0 && plVar15 != (lyxml_elem *)0x0) {
        plVar3 = plVar15;
        if (plVar15->parent == (lyxml_elem *)0x0) {
          do {
            plVar15 = plVar3;
            plVar3 = plVar15->prev;
          } while (plVar15->prev->next != (lyxml_elem *)0x0);
        }
        else {
          plVar15 = plVar15->parent->child;
        }
      }
      local_a8 = plVar14;
      local_a0 = plVar13;
      local_90 = plVar9;
      if ((options & 0x10U) == 0) {
LAB_0013f7c1:
        local_40 = (lyxml_elem *)0x0;
      }
      else {
        iVar5 = strcmp(plVar15->name,"action");
        if ((iVar5 == 0) &&
           (iVar5 = strcmp(plVar15->ns->value,"urn:ietf:params:xml:ns:yang:1"), iVar5 == 0)) {
          plVar15 = plVar15->child;
          if (((uint)options >> 10 & 1) == 0) goto LAB_0013f7c1;
          local_40 = plVar15->parent;
        }
        else {
          local_40 = (lyxml_elem *)0x0;
        }
      }
      local_48 = (lyd_node *)0x0;
      plVar14 = (lyd_node *)0x0;
      do {
        if (plVar15 == (lyxml_elem *)0x0) break;
        plVar3 = plVar15->next;
        iVar5 = xml_parse_data(ctx,plVar15,plVar8,local_38,plVar14,options,local_88,&local_48,
                               &local_80,local_98);
        if (iVar5 != 0) {
          plVar15 = local_40;
          if (local_90 != (lyd_node *)0x0) {
            local_38 = local_90;
          }
          goto LAB_0013fb14;
        }
        if (((uint)options >> 10 & 1) != 0) {
          lyxml_free(ctx,plVar15);
          *root = plVar3;
        }
        if (((local_48 != (lyd_node *)0x0) && (plVar14 = local_48, ((uint)options >> 0x11 & 1) != 0)
            ) && (local_48->schema->module ==
                  (ctx->models).list[(ulong)ctx->internal_module_count - 1])) {
          options = options & 0xfffdffff;
        }
        if (local_38 == (lyd_node *)0x0) {
          local_38 = local_48;
        }
        plVar15 = plVar3;
      } while (((uint)options >> 0xc & 1) == 0);
      if (local_90 != (lyd_node *)0x0) {
        local_38 = local_90;
      }
      plVar14 = local_38;
      if ((((options & 0x20U) == 0) || (local_a8->schema->nodetype == LYS_RPC)) &&
         ((plVar8 = local_80, (options & 0x50U) != 0 && (local_80 == (lyd_node *)0x0)))) {
        pcVar10 = "action";
        if ((options & 0x10U) == 0) {
          pcVar10 = "notification";
        }
        ly_vlog(ctx,LYE_INELEM,(uint)(local_38 != (lyd_node *)0x0) * 3,local_38,pcVar10);
        plVar15 = local_40;
      }
      else {
        local_80 = plVar8;
        plVar8 = local_38;
        plVar9 = local_38;
        if (((((uint)options >> 0x11 & 1) == 0) ||
            (plVar8 = ly_ctx_info(ctx), plVar9 = plVar8, plVar14 == (lyd_node *)0x0)) ||
           (iVar5 = lyd_merge(plVar14,plVar8,0x500), plVar8 = local_38, plVar9 = local_38,
           iVar5 == 0)) {
          while (local_38 = plVar9, local_48 = plVar8, plVar8 != (lyd_node *)0x0) {
            if ((((plVar8->schema->nodetype & (LYS_LIST|LYS_LEAFLIST)) != LYS_UNKNOWN) &&
                ((plVar8->validity & 1) != 0)) &&
               (iVar5 = lyv_data_dup(plVar8,local_38), plVar15 = local_40, iVar5 != 0))
            goto LAB_0013fb14;
            plVar9 = local_38;
            plVar8 = local_48->next;
          }
          iVar5 = lyd_defaults_add_unres
                            (&local_38,options,ctx,(lys_module **)0x0,0,local_a0,local_80,local_88,1
                            );
          plVar15 = local_40;
          if (iVar5 == 0) {
            if ((options & 0x2080U) == 0) {
              plVar14 = local_80;
              if (local_80 == (lyd_node *)0x0) {
                plVar14 = local_38;
              }
              iVar5 = lyd_check_mandatory_tree(plVar14,ctx,(lys_module **)0x0,0,options);
              plVar15 = local_40;
              if (iVar5 != 0) goto LAB_0013fb14;
            }
            if (local_40 != (lyxml_elem *)0x0) {
              lyxml_free(ctx,local_40);
            }
            puVar4 = local_88;
            free(local_88->node);
            free(puVar4->type);
            free(puVar4);
            return local_38;
          }
        }
        else {
          ly_log(ctx,LY_LLERR,LY_EINT,"Adding ietf-yang-library data failed.");
          plVar15 = local_40;
        }
      }
LAB_0013fb14:
      lyd_free_withsiblings(local_38);
      if (plVar15 != (lyxml_elem *)0x0) {
        lyxml_free(ctx,plVar15);
      }
      puVar4 = local_88;
      free(local_88->node);
      free(puVar4->type);
      free(puVar4);
      return (lyd_node *)0x0;
    }
    if ((options & 0x50U) == 0) {
      lyd_validate(&local_38,options,ctx);
      return local_38;
    }
    pcVar10 = "%s: *root identifies RPC/Notification so it cannot be NULL.";
  }
  no = LY_EINVAL;
LAB_0013f556:
  ly_log(ctx,LY_LLERR,no,pcVar10,"lyd_parse_xml");
  return (lyd_node *)0x0;
}

Assistant:

lyd_node *
lyd_parse_xml(struct ly_ctx *ctx, struct lyxml_elem **root, int options, ...)
{
    va_list ap;
    int r;
    struct unres_data *unres = NULL;
    const struct lyd_node *rpc_act = NULL, *data_tree = NULL;
    struct lyd_node *result = NULL, *iter, *last, *reply_parent = NULL, *reply_top = NULL, *act_notif = NULL;
    struct lyxml_elem *xmlstart, *xmlelem, *xmlaux, *xmlfree = NULL;
    const char *yang_data_name = NULL;

    if (!ctx || !root) {
        LOGARG;
        return NULL;
    }

    if (lyp_data_check_options(ctx, options, __func__)) {
        return NULL;
    }

    if (!(*root) && !(options & LYD_OPT_RPCREPLY)) {
        /* empty tree */
        if (options & (LYD_OPT_RPC | LYD_OPT_NOTIF)) {
            /* error, top level node identify RPC and Notification */
            LOGERR(ctx, LY_EINVAL, "%s: *root identifies RPC/Notification so it cannot be NULL.", __func__);
            return NULL;
        } else if (!(options & LYD_OPT_RPCREPLY)) {
            /* others - no work is needed, just check for missing mandatory nodes */
            lyd_validate(&result, options, ctx);
            return result;
        }
        /* continue with empty RPC reply, for which we need RPC */
    }

    unres = calloc(1, sizeof *unres);
    LY_CHECK_ERR_RETURN(!unres, LOGMEM(ctx), NULL);

    va_start(ap, options);
    if (options & LYD_OPT_RPCREPLY) {
        rpc_act = va_arg(ap, const struct lyd_node *);
        if (!rpc_act || rpc_act->parent || !(rpc_act->schema->nodetype & (LYS_RPC | LYS_LIST | LYS_CONTAINER))) {
            LOGERR(ctx, LY_EINVAL, "%s: invalid variable parameter (const struct lyd_node *rpc_act).", __func__);
            goto error;
        }
        if (rpc_act->schema->nodetype == LYS_RPC) {
            /* RPC request */
            reply_top = reply_parent = _lyd_new(NULL, rpc_act->schema, 0);
        } else {
            /* action request */
            reply_top = lyd_dup(rpc_act, 1);
            LY_TREE_DFS_BEGIN(reply_top, iter, reply_parent) {
                if (reply_parent->schema->nodetype == LYS_ACTION) {
                    break;
                }
                LY_TREE_DFS_END(reply_top, iter, reply_parent);
            }
            if (!reply_parent) {
                LOGERR(ctx, LY_EINVAL, "%s: invalid variable parameter (const struct lyd_node *rpc_act).", __func__);
                lyd_free_withsiblings(reply_top);
                goto error;
            }
            lyd_free_withsiblings(reply_parent->child);
        }
    }
    if (options & (LYD_OPT_RPC | LYD_OPT_NOTIF | LYD_OPT_RPCREPLY)) {
        data_tree = va_arg(ap, const struct lyd_node *);
        if (data_tree) {
            if (options & LYD_OPT_NOEXTDEPS) {
                LOGERR(ctx, LY_EINVAL, "%s: invalid parameter (variable arg const struct lyd_node *data_tree and LYD_OPT_NOEXTDEPS set).",
                       __func__);
                goto error;
            }

            LY_TREE_FOR((struct lyd_node *)data_tree, iter) {
                if (iter->parent) {
                    /* a sibling is not top-level */
                    LOGERR(ctx, LY_EINVAL, "%s: invalid variable parameter (const struct lyd_node *data_tree).", __func__);
                    goto error;
                }
            }

            /* move it to the beginning */
            for (; data_tree->prev->next; data_tree = data_tree->prev);

            /* LYD_OPT_NOSIBLINGS cannot be set in this case */
            if (options & LYD_OPT_NOSIBLINGS) {
                LOGERR(ctx, LY_EINVAL, "%s: invalid parameter (variable arg const struct lyd_node *data_tree with LYD_OPT_NOSIBLINGS).", __func__);
                goto error;
            }
        }
    }
    if (options & LYD_OPT_DATA_TEMPLATE) {
        yang_data_name = va_arg(ap, const char *);
    }

    if ((*root) && !(options & LYD_OPT_NOSIBLINGS)) {
        /* locate the first root to process */
        if ((*root)->parent) {
            xmlstart = (*root)->parent->child;
        } else {
            xmlstart = *root;
            while(xmlstart->prev->next) {
                xmlstart = xmlstart->prev;
            }
        }
    } else {
        xmlstart = *root;
    }

    if ((options & LYD_OPT_RPC)
            && !strcmp(xmlstart->name, "action") && !strcmp(xmlstart->ns->value, "urn:ietf:params:xml:ns:yang:1")) {
        /* it's an action, not a simple RPC */
        xmlstart = xmlstart->child;
        if (options & LYD_OPT_DESTRUCT) {
            /* free it later */
            xmlfree = xmlstart->parent;
        }
    }

    iter = last = NULL;
    LY_TREE_FOR_SAFE(xmlstart, xmlaux, xmlelem) {
        r = xml_parse_data(ctx, xmlelem, reply_parent, result, last, options, unres, &iter, &act_notif, yang_data_name);
        if (r) {
            if (reply_top) {
                result = reply_top;
            }
            goto error;
        } else if (options & LYD_OPT_DESTRUCT) {
            lyxml_free(ctx, xmlelem);
            *root = xmlaux;
        }
        if (iter) {
            last = iter;
            if ((options & LYD_OPT_DATA_ADD_YANGLIB) && iter->schema->module == ctx->models.list[ctx->internal_module_count - 1]) {
                /* ietf-yang-library data present, so ignore the option to add them */
                options &= ~LYD_OPT_DATA_ADD_YANGLIB;
            }
        }
        if (!result) {
            result = iter;
        }

        if (options & LYD_OPT_NOSIBLINGS) {
            /* stop after the first processed root */
            break;
        }
    }

    if (reply_top) {
        result = reply_top;
    }

    if ((options & LYD_OPT_RPCREPLY) && (rpc_act->schema->nodetype != LYS_RPC)) {
        /* action reply */
        act_notif = reply_parent;
    } else if ((options & (LYD_OPT_RPC | LYD_OPT_NOTIF)) && !act_notif) {
        LOGVAL(ctx, LYE_INELEM, (result ? LY_VLOG_LYD : LY_VLOG_NONE), result, (options & LYD_OPT_RPC ? "action" : "notification"));
        goto error;
    }

    /* add missing ietf-yang-library if requested */
    if (options & LYD_OPT_DATA_ADD_YANGLIB) {
        if (!result) {
            result = ly_ctx_info(ctx);
        } else if (lyd_merge(result, ly_ctx_info(ctx), LYD_OPT_DESTRUCT | LYD_OPT_EXPLICIT)) {
            LOGERR(ctx, LY_EINT, "Adding ietf-yang-library data failed.");
            goto error;
        }
    }

    /* check for uniqueness of top-level lists/leaflists because
     * only the inner instances were tested in lyv_data_content() */
    LY_TREE_FOR(result, iter) {
        if (!(iter->schema->nodetype & (LYS_LIST | LYS_LEAFLIST)) || !(iter->validity & LYD_VAL_DUP)) {
            continue;
        }

        if (lyv_data_dup(iter, result)) {
            goto error;
        }
    }

    /* add default values, resolve unres and check for mandatory nodes in final tree */
    if (lyd_defaults_add_unres(&result, options, ctx, NULL, 0, data_tree, act_notif, unres, 1)) {
        goto error;
    }
    if (!(options & (LYD_OPT_TRUSTED | LYD_OPT_NOTIF_FILTER))
            && lyd_check_mandatory_tree((act_notif ? act_notif : result), ctx, NULL, 0, options)) {
        goto error;
    }

    if (xmlfree) {
        lyxml_free(ctx, xmlfree);
    }
    free(unres->node);
    free(unres->type);
    free(unres);
    va_end(ap);
    return result;

error:
    lyd_free_withsiblings(result);
    if (xmlfree) {
        lyxml_free(ctx, xmlfree);
    }
    free(unres->node);
    free(unres->type);
    free(unres);
    va_end(ap);
    return NULL;
}